

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O3

bool __thiscall DOMTest::testScanner(DOMTest *this,XercesDOMParser *parser)

{
  XMLSize_t slices_1 [2];
  SlicerSource src;
  char sampleDoc [185];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined **local_138 [6];
  undefined1 *local_108;
  undefined8 local_100;
  XMLSize_t *local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [192];
  
  memcpy(local_e8,
         "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<!-- Document element is document -->\n<document attr=\"value\">\n   <!-- a tag -->\n   <tag>foo</tag>\n\n   <!-- another tag -->\n   <tag/>\n</document>\n"
         ,0xb9);
  xercesc_4_0::InputSource::InputSource
            ((InputSource *)local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138[0] = &PTR__InputSource_0012dc88;
  local_100 = 0xb8;
  local_f8 = (XMLSize_t *)0x0;
  uStack_f0 = 0;
  local_108 = local_e8;
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource((InputSource *)local_138);
  local_148 = 0x8e;
  uStack_140 = 1;
  xercesc_4_0::InputSource::InputSource
            ((InputSource *)local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138[0] = &PTR__InputSource_0012dc88;
  local_100 = 0xb8;
  uStack_f0 = 2;
  local_108 = local_e8;
  local_f8 = &local_148;
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource((InputSource *)local_138);
  local_148 = 0x8e;
  uStack_140 = 2;
  xercesc_4_0::InputSource::InputSource
            ((InputSource *)local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138[0] = &PTR__InputSource_0012dc88;
  local_100 = 0xb8;
  uStack_f0 = 2;
  local_108 = local_e8;
  local_f8 = &local_148;
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource((InputSource *)local_138);
  xercesc_4_0::InputSource::InputSource
            ((InputSource *)local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_138[0] = &PTR__InputSource_0012dc88;
  local_100 = 0xb8;
  local_f8 = testScanner::slices;
  uStack_f0 = 0xb8;
  local_108 = local_e8;
  xercesc_4_0::AbstractDOMParser::parse((InputSource *)parser);
  xercesc_4_0::InputSource::~InputSource((InputSource *)local_138);
  return true;
}

Assistant:

bool DOMTest::testScanner(XercesDOMParser* parser) {
    bool OK = true;

    const char sampleDoc[] =
	    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
	    "<!-- Document element is document -->\n"
	    "<document attr=\"value\">\n"
	    "   <!-- a tag -->\n"
	    "   <tag>foo</tag>\n"
	    "\n"
	    "   <!-- another tag -->\n"
	    "   <tag/>\n"
	    "</document>\n";
    const size_t sampleDocSize = sizeof(sampleDoc) - 1;
    const XMLByte* sampleDocXML = reinterpret_cast<const XMLByte*>(sampleDoc);

    try
	{
		// First, try parsing the document in one hit
		SlicerSource src(sampleDocXML, sampleDocSize);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!' and '--' of a comment
		const XMLSize_t slices[] = { 142, 1 };
		const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!-' and '-' of a comment
		const XMLSize_t slices[] = { 142, 2 };
		const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

	try
	{
		// Now, parse it in blocks that end between the '<',  '!-' and '-' of a comment
		static const XMLSize_t slices[] =
        {
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
            1, 1, 1, 1};
		static const XMLSize_t count = sizeof(slices) / sizeof(slices[0]);
		SlicerSource src(sampleDocXML, sampleDocSize, slices, count);
		parser->parse(src);
	}
	catch (...)
	{
        OK = false;
        fprintf(stderr, "Variable chunks parsing failed at line %i\n", __LINE__);
	}

    return OK;
}